

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

void __thiscall
Model::get_gaussian_grad
          (Model *this,double **g,double label,double sigma,int centerId,int contextId,
          double current_lr)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  int d;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  uVar6 = (ulong)this->dim_size;
  pvVar4 = operator_new__(uVar6 * 8);
  pvVar5 = operator_new__(uVar6 * 8);
  dVar9 = sigma * sigma;
  if (uVar6 == 0) {
    dVar8 = 0.0;
  }
  else {
    pdVar2 = this->emb1[contextId];
    pdVar3 = this->emb0[centerId];
    uVar7 = 0;
    do {
      *(double *)((long)pvVar5 + uVar7 * 8) = pdVar2[uVar7] - pdVar3[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
    dVar8 = 0.0;
    uVar7 = 0;
    do {
      dVar1 = *(double *)((long)pvVar5 + uVar7 * 8);
      dVar8 = dVar8 + dVar1 * dVar1;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  dVar8 = exp(-dVar8 / (dVar9 + dVar9));
  uVar6 = (ulong)this->dim_size;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      *(double *)((long)pvVar4 + uVar7 * 8) =
           (*(double *)((long)pvVar5 + uVar7 * 8) / dVar9) *
           ((label - dVar8) + (label - dVar8)) * dVar8;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
    pdVar2 = *g;
    uVar7 = 0;
    do {
      pdVar2[uVar7] = *(double *)((long)pvVar4 + uVar7 * 8) * -current_lr;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  operator_delete__(pvVar5);
  operator_delete__(pvVar4);
  return;
}

Assistant:

void Model::get_gaussian_grad(double *&g, double label, double sigma, int centerId, int contextId, double current_lr) {

    double eta, e, *diff,  *z;
    z = new double[this->dim_size];
    diff = new double[this->dim_size];

    double var = sigma * sigma;

    for (int d = 0; d < this->dim_size; d++)
        diff[d] = this->emb1[contextId][d] - this->emb0[centerId][d];

    eta = 0.0;
    for (int d = 0; d < this->dim_size; d++)
        eta += diff[d]*diff[d];

    e = exp( -eta/(2.0*var) );
    for (int d = 0; d < this->dim_size; d++)
        z[d] = 2.0 * ( label-e  ) * ( e ) * ( diff[d]/var );

    for (int d = 0; d < this->dim_size; d++)
        g[d] = -current_lr * z[d]; // minus comes from the objective function, minimization

    delete [] diff;
    delete [] z;

}